

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::numbers_internal::safe_strto64_base
          (numbers_internal *this,string_view text,Nonnull<int64_t_*> value,int base)

{
  string_view text_00;
  bool bVar1;
  int base_local;
  Nonnull<int64_t_*> value_local;
  string_view text_local;
  
  text_00._M_str = (char *)text._M_len;
  text_00._M_len = (size_t)this;
  bVar1 = anon_unknown_0::safe_int_internal<long>(text_00,(Nonnull<long_*>)text._M_str,(int)value);
  return bVar1;
}

Assistant:

bool safe_strto64_base(absl::string_view text, absl::Nonnull<int64_t*> value,
                       int base) {
  return safe_int_internal<int64_t>(text, value, base);
}